

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O1

int main(void)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  void *ptr;
  slab_arena *psVar6;
  FILE *__stream;
  byte *pbVar7;
  byte *pbVar8;
  byte bVar9;
  uint uVar10;
  ulong extraout_RDX;
  slab_arena *arena_00;
  uint32_t *puVar11;
  char *pcVar12;
  slab_arena *psVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  slab_arena *arena_01;
  byte *__s;
  byte bStack_4b0;
  undefined7 uStack_4af;
  char cStack_4a8;
  undefined8 uStack_a8;
  slab_arena *psStack_a0;
  slab_arena *psStack_98;
  undefined8 uStack_90;
  char *pcStack_88;
  slab_arena *psStack_80;
  undefined *puStack_78;
  code *pcStack_70;
  undefined1 local_68 [8];
  slab_arena arena;
  quota quota;
  
  pcStack_70 = (code *)0x1015e7;
  plan(2);
  pcStack_70 = (code *)0x1015f9;
  _space(_stdout);
  pcStack_70 = (code *)0x101611;
  printf("# *** %s ***\n","main");
  pcStack_70 = (code *)0x10161b;
  plan(0x12);
  pcStack_70 = (code *)0x101623;
  _space(_stdout);
  pcStack_70 = (code *)0x101634;
  printf("# *** %s ***\n","slab_test_basic");
  arena.slab_size = 0;
  arena.flags = 0;
  pcStack_70 = (code *)0x101658;
  slab_arena_create((slab_arena *)local_68,(quota *)&arena.slab_size,0,0,2);
  pcStack_70 = (code *)0x101690;
  _ok((uint)(arena.arena == (void *)0x0),"arena.prealloc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xb9,
      "line %d",0xb9);
  pcStack_70 = (code *)0x1016bc;
  _ok((uint)(arena.flags == 0),"quota_total(&quota) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xba,
      "line %d",0xba);
  pcStack_70 = (code *)0x1016e9;
  _ok((uint)(arena.prealloc == 0),"arena.used == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xbb,
      "line %d",0xbb);
  pcStack_70 = (code *)0x10171a;
  _ok((uint)((int)arena.quota == 0x10000),"arena.slab_size == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xbc,
      "line %d",0xbc);
  pcStack_70 = (code *)0x101722;
  slab_arena_destroy((slab_arena *)local_68);
  arena.slab_size = 0;
  arena.flags = 0x40;
  pcStack_70 = (code *)0x10174a;
  slab_arena_create((slab_arena *)local_68,(quota *)&arena.slab_size,1,1,2);
  pcStack_70 = (code *)0x101778;
  _ok((uint)(arena.arena == (void *)0x10000),"arena.prealloc == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc3,
      "line %d",0xc3);
  pcStack_70 = (code *)0x1017a2;
  _ok((uint)(arena.flags == 0x40),"quota_total(&quota) == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc4,
      "line %d",0xc4);
  pcStack_70 = (code *)0x1017cc;
  _ok((uint)(arena.prealloc == 0),"arena.used == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc5,
      "line %d",0xc5);
  pcStack_70 = (code *)0x1017f6;
  _ok((uint)((int)arena.quota == 0x10000),"arena.slab_size == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc6,
      "line %d",0xc6);
  pcStack_70 = (code *)0x1017fe;
  pvVar5 = slab_map((slab_arena *)local_68);
  pcStack_70 = (code *)0x101829;
  _ok((uint)(pvVar5 != (void *)0x0),"ptr != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",200,
      "line %d",200);
  pcStack_70 = (code *)0x101857;
  _ok((uint)(arena.prealloc == 0x10000),"arena.used == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc9,
      "line %d",0xc9);
  pcStack_70 = (code *)0x10185f;
  ptr = slab_map((slab_arena *)local_68);
  pcStack_70 = (code *)0x10188a;
  _ok((uint)(ptr == (void *)0x0),"ptr1 == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xcb,
      "line %d",0xcb);
  pcStack_70 = (code *)0x1018b8;
  _ok((uint)(arena.prealloc == 0x10000),"arena.used == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xcc,
      "line %d",0xcc);
  pcStack_70 = (code *)0x1018c3;
  slab_unmap((slab_arena *)local_68,pvVar5);
  pcStack_70 = (code *)0x1018f4;
  _ok((uint)(arena.prealloc == 0x10000),"arena.used == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xce,
      "line %d",0xce);
  pcStack_70 = (code *)0x1018ff;
  slab_unmap((slab_arena *)local_68,ptr);
  pcStack_70 = (code *)0x101929;
  _ok((uint)(arena.prealloc == 0x10000),"arena.used == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd0,
      "line %d",0xd0);
  pcStack_70 = (code *)0x101931;
  slab_arena_destroy((slab_arena *)local_68);
  arena_01 = (slab_arena *)0x7a200000000;
  arena.slab_size = 0;
  arena.flags = 0x7a2;
  pcStack_70 = (code *)0x101960;
  slab_arena_create((slab_arena *)local_68,(quota *)&arena.slab_size,3000000,1,2);
  pcStack_70 = (code *)0x10198d;
  _ok((uint)(arena.arena == (void *)0x1f0000),"arena.prealloc == 2031616",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd6,
      "line %d",0xd6);
  pcStack_70 = (code *)0x1019b9;
  _ok((uint)(arena.flags == 0x7a2),"quota_total(&quota) == 2000896",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd7,
      "line %d",0xd7);
  pcStack_70 = (code *)0x1019e3;
  _ok((uint)(arena.prealloc == 0),"arena.used == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd8,
      "line %d",0xd8);
  pcStack_70 = (code *)0x101a11;
  _ok((uint)((int)arena.quota == 0x10000),"arena.slab_size == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd9,
      "line %d",0xd9);
  pcStack_70 = (code *)0x101a20;
  slab_arena_destroy((slab_arena *)local_68);
  pcStack_70 = (code *)0x101a28;
  _space(_stdout);
  pcStack_70 = (code *)0x101a3d;
  printf("# *** %s: done ***\n","slab_test_basic");
  pcStack_70 = (code *)0x101a42;
  check_plan();
  pcStack_70 = (code *)0x101a4c;
  plan(1);
  pcStack_70 = (code *)0x101a54;
  _space(_stdout);
  pcStack_70 = (code *)0x101a69;
  printf("# *** %s ***\n");
  pcStack_70 = (code *)0x101a77;
  iVar3 = access("/proc/self/smaps",0);
  if (iVar3 != 0) {
LAB_00101b33:
    pcStack_70 = (code *)0x101b5f;
    _ok(1,"true",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0x7b
        ,"line %d",0x7b);
    pcStack_70 = (code *)0x101b67;
    _space(_stdout);
    pcStack_70 = (code *)0x101b7f;
    printf("# *** %s: done ***\n","slab_test_madvise");
    pcStack_70 = (code *)0x101b84;
    check_plan();
    pcStack_70 = (code *)0x101b8c;
    _space(_stdout);
    pcStack_70 = (code *)0x101b9d;
    printf("# *** %s: done ***\n","main");
    pcStack_70 = (code *)0x101ba2;
    iVar3 = check_plan();
    return iVar3;
  }
  puVar11 = &arena.slab_size;
  arena.slab_size = 0;
  arena.flags = 0x7a2;
  arena_00 = (slab_arena *)local_68;
  uVar10 = 1;
  uVar17 = 0x80000005;
  pcStack_70 = (code *)0x101aa5;
  slab_arena_create(arena_00,(quota *)puVar11,3000000,1,-0x7ffffffb);
  pcStack_70 = (code *)0x101aad;
  psVar13 = arena_00;
  psVar6 = (slab_arena *)slab_map(arena_00);
  if (psVar6 == (slab_arena *)0x0) {
    pcStack_70 = (code *)0x101bb6;
    main_cold_4();
LAB_00101bb6:
    pcStack_70 = (code *)0x101bbb;
    main_cold_1();
  }
  else {
    pcStack_70 = (code *)0x101ac1;
    psVar13 = psVar6;
    _Var2 = vma_has_flag((unsigned_long)psVar6,(char *)puVar11);
    arena_00 = psVar6;
    if (!_Var2) goto LAB_00101bb6;
    arena_01 = (slab_arena *)local_68;
    pcStack_70 = (code *)0x101ad8;
    slab_unmap(arena_01,psVar6);
    pcStack_70 = (code *)0x101ae0;
    slab_arena_destroy(arena_01);
    puVar11 = &arena.slab_size;
    arena.slab_size = 0;
    arena.flags = 0x7a2;
    uVar10 = 0x10000;
    uVar17 = 0x80000005;
    pcStack_70 = (code *)0x101afc;
    slab_arena_create(arena_01,(quota *)puVar11,0,0x10000,-0x7ffffffb);
    pcStack_70 = (code *)0x101b04;
    psVar13 = arena_01;
    psVar6 = (slab_arena *)slab_map(arena_01);
    if (psVar6 != (slab_arena *)0x0) {
      pcStack_70 = (code *)0x101b18;
      psVar13 = psVar6;
      _Var2 = vma_has_flag((unsigned_long)psVar6,(char *)puVar11);
      if (_Var2) {
        pcStack_70 = (code *)0x101b2b;
        slab_unmap(arena_01,psVar6);
        pcStack_70 = (code *)0x101b33;
        slab_arena_destroy(arena_01);
        goto LAB_00101b33;
      }
      goto LAB_00101bc0;
    }
  }
  psVar6 = arena_00;
  pcStack_70 = (code *)0x101bc0;
  main_cold_3();
LAB_00101bc0:
  pcStack_70 = vma_has_flag;
  main_cold_2();
  puStack_78 = &stdout;
  pcStack_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c";
  uStack_90 = 0x7a200000000;
  psStack_a0 = (slab_arena *)0x0;
  uStack_a8 = 0;
  pcVar14 = "/proc/self/smaps";
  pcVar12 = "r";
  psStack_98 = psVar6;
  psStack_80 = arena_01;
  pcStack_70 = (code *)&stack0xfffffffffffffff8;
  __stream = fopen("/proc/self/smaps","r");
  if (__stream == (FILE *)0x0) {
    vma_has_flag_cold_1();
    uVar15 = 0x10000;
    if (0x10000 < uVar10) {
      uVar15 = (ulong)uVar10;
    }
    lVar1 = 0x3f;
    if (uVar15 - 1 != 0) {
      for (; uVar15 - 1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar16 = 1L << (-((byte)lVar1 ^ 0x3f) & 0x3f);
    pcVar14[0] = '\0';
    pcVar14[1] = '\0';
    pcVar14[2] = '\0';
    pcVar14[3] = '\0';
    pcVar14[4] = '\0';
    pcVar14[5] = '\0';
    pcVar14[6] = '\0';
    pcVar14[7] = '\0';
    *(int *)(pcVar14 + 0x28) = (int)uVar16;
    *(char **)(pcVar14 + 0x20) = pcVar12;
    uVar15 = (ulong)*(uint *)(pcVar12 + 4) << 10;
    if (extraout_RDX <= uVar15) {
      uVar15 = extraout_RDX;
    }
    uVar16 = uVar16 & 0xffffffff;
    uVar15 = -uVar16 & (uVar15 + uVar16) - 1;
    *(ulong *)(pcVar14 + 0x10) = uVar15;
    pcVar14[0x18] = '\0';
    pcVar14[0x19] = '\0';
    pcVar14[0x1a] = '\0';
    pcVar14[0x1b] = '\0';
    pcVar14[0x1c] = '\0';
    pcVar14[0x1d] = '\0';
    pcVar14[0x1e] = '\0';
    pcVar14[0x1f] = '\0';
    if ((int)uVar17 < 0) {
      if ((~uVar17 & 0x80000002) != 0 && (~uVar17 & 0x80000001) != 0) {
        __assert_fail("IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_PRIVATE) || IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_SHARED)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                      ,0xad,"void slab_arena_flags_init(struct slab_arena *, int)");
      }
      *(uint *)(pcVar14 + 0x2c) = uVar17;
    }
    else {
      if ((uVar17 & 3) == 0) {
        __assert_fail("flags & (MAP_PRIVATE | MAP_SHARED)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                      ,0xa4,"void slab_arena_flags_init(struct slab_arena *, int)");
      }
      if (uVar17 == 2) {
        pcVar14[0x2c] = '\x01';
        pcVar14[0x2d] = '\0';
        pcVar14[0x2e] = '\0';
        pcVar14[0x2f] = -0x80;
      }
      else {
        pcVar14[0x2c] = '\x02';
        pcVar14[0x2d] = '\0';
        pcVar14[0x2e] = '\0';
        pcVar14[0x2f] = -0x80;
      }
    }
    iVar3 = 0;
    if (uVar15 == 0) {
      pvVar5 = (void *)0x0;
    }
    else {
      pvVar5 = mmap_checked(uVar15,uVar16,*(int *)(pcVar14 + 0x2c));
    }
    *(void **)(pcVar14 + 8) = pvVar5;
    madvise_checked(pvVar5,*(size_t *)(pcVar14 + 0x10),*(int *)(pcVar14 + 0x2c));
    if (*(long *)(pcVar14 + 0x10) != 0) {
      iVar3 = -(uint)(*(long *)(pcVar14 + 8) == 0);
    }
    return iVar3;
  }
  __s = &bStack_4b0;
  pcVar12 = fgets((char *)__s,0x400,__stream);
  while (pcVar12 != (char *)0x0) {
    if (bStack_4b0 != 0) {
      pbVar7 = (byte *)&uStack_4af;
      pbVar8 = (byte *)&uStack_4af;
      bVar9 = bStack_4b0;
      do {
        pbVar7 = pbVar7 + 1;
        if (9 < (byte)(bVar9 - 0x30)) {
          uVar10 = bVar9 - 0x2d;
          if (0x39 < uVar10) break;
          if ((0x3f0000003f00000U >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
            if ((ulong)uVar10 == 0) {
              bVar9 = *pbVar8;
              goto LAB_00101cb5;
            }
            break;
          }
        }
        bVar9 = *pbVar8;
        pbVar8 = pbVar8 + 1;
      } while (bVar9 != 0);
    }
LAB_00101c77:
    if ((cStack_4a8 == ' ' && CONCAT71(uStack_4af,bStack_4b0) == 0x3a7367616c466d56) &&
       (psStack_a0 == psVar13)) goto LAB_00101d06;
LAB_00101c97:
    pcVar12 = fgets((char *)__s,0x400,__stream);
  }
  __s = (byte *)0x0;
LAB_00101d06:
  if ((__s == (byte *)0x0) || (pcVar12 = strtok((char *)__s," \n"), pcVar12 == (char *)0x0)) {
    iVar3 = 0;
  }
  else {
    do {
      iVar4 = strcmp(pcVar12,"dd");
      psVar13 = (slab_arena *)CONCAT71((int7)((ulong)psVar13 >> 8),iVar4 == 0);
      iVar3 = (int)psVar13;
      if (iVar4 == 0) break;
      pcVar12 = strtok((char *)0x0," \n");
    } while (pcVar12 != (char *)0x0);
  }
  fclose(__stream);
  return iVar3;
LAB_00101cb5:
  if (bVar9 == 0) goto LAB_00101c77;
  if ((9 < (byte)(bVar9 - 0x30)) &&
     ((0x25 < bVar9 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar9 - 0x41) & 0x3f) & 1) == 0)))) {
    if (bVar9 == 0x20) {
      __isoc99_sscanf(__s,"%lx-%lx",&psStack_a0,&uStack_a8);
      goto LAB_00101c97;
    }
    goto LAB_00101c77;
  }
  bVar9 = *pbVar7;
  pbVar7 = pbVar7 + 1;
  goto LAB_00101cb5;
}

Assistant:

int
main(void)
{
	plan(2);
	header();

	slab_test_basic();
#ifdef ENABLE_ASAN
	slab_test_membership();
#else
	slab_test_madvise();
#endif

	footer();
	return check_plan();
}